

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

size_t google::protobuf::internal::VarintSize<false,true,int>(int *data,int n)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  uVar3 = n & 0xffffffe0;
  if ((int)uVar3 < 1) {
    uVar4 = 0;
    iVar6 = 0;
    uVar10 = uVar3;
  }
  else {
    iVar11 = 0;
    iVar12 = 0;
    iVar13 = 0;
    iVar6 = 0;
    iVar7 = 0;
    iVar8 = 0;
    iVar9 = 0;
    uVar5 = 0;
    uVar10 = uVar3;
    do {
      puVar1 = (uint *)(data + uVar5);
      iVar6 = iVar6 - ((int)*puVar1 >> 0x1f);
      iVar7 = iVar7 - ((int)puVar1[1] >> 0x1f);
      iVar8 = iVar8 - ((int)puVar1[2] >> 0x1f);
      iVar9 = iVar9 - ((int)puVar1[3] >> 0x1f);
      uVar4 = *puVar1 ^ 0x80000000;
      uVar14 = puVar1[1] ^ 0x80000000;
      uVar15 = puVar1[2] ^ 0x80000000;
      uVar16 = puVar1[3] ^ 0x80000000;
      uVar10 = uVar10 + (-0x7fffff81 < (int)uVar4) + (uint)(-0x7fffc001 < (int)uVar4) +
               (uint)(-0x7fe00001 < (int)uVar4) + (uint)(-0x70000001 < (int)uVar4);
      iVar11 = iVar11 + (uint)(-0x7fffff81 < (int)uVar14) + (uint)(-0x7fffc001 < (int)uVar14) +
               (uint)(-0x7fe00001 < (int)uVar14) + (uint)(-0x70000001 < (int)uVar14);
      iVar12 = iVar12 + (uint)(-0x7fffff81 < (int)uVar15) + (uint)(-0x7fffc001 < (int)uVar15) +
               (uint)(-0x7fe00001 < (int)uVar15) + (uint)(-0x70000001 < (int)uVar15);
      iVar13 = iVar13 + (uint)(-0x7fffff81 < (int)uVar16) + (uint)(-0x7fffc001 < (int)uVar16) +
               (uint)(-0x7fe00001 < (int)uVar16) + (uint)(-0x70000001 < (int)uVar16);
      uVar5 = uVar5 + 4;
    } while (uVar3 != uVar5);
    iVar6 = (iVar9 + iVar7 + iVar8 + iVar6) * 5;
    uVar10 = iVar13 + iVar11 + iVar12 + uVar10;
    uVar4 = uVar3;
  }
  if ((int)uVar4 < n) {
    uVar5 = (ulong)uVar4;
    do {
      lVar2 = 0x3f;
      if (((long)data[uVar5] | 1U) != 0) {
        for (; ((long)data[uVar5] | 1U) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar10 = uVar10 + ((int)lVar2 * 9 + 0x49U >> 6);
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
  }
  return (ulong)(uVar10 + iVar6);
}

Assistant:

static size_t VarintSize(const T* data, const int n) {
  static_assert(sizeof(T) == 4, "This routine only works for 32 bit integers");
  // is_unsigned<T> => !ZigZag
  static_assert(
      (std::is_unsigned<T>::value ^ ZigZag) || std::is_signed<T>::value,
      "Cannot ZigZag encode unsigned types");
  // is_unsigned<T> => !SignExtended
  static_assert(
      (std::is_unsigned<T>::value ^ SignExtended) || std::is_signed<T>::value,
      "Cannot SignExtended unsigned types");
  static_assert(!(SignExtended && ZigZag),
                "Cannot SignExtended and ZigZag on the same type");
  // This approach is only faster when vectorized, and the vectorized
  // implementation only works in units of the platform's vector width, and is
  // only faster once a certain number of iterations are used. Normally the
  // compiler generates two loops - one partially unrolled vectorized loop that
  // processes big chunks, and a second "epilogue" scalar loop to finish up the
  // remainder. This is done manually here so that the faster scalar
  // implementation is used for small inputs and for the epilogue.
  int vectorN = n & -32;
  uint32_t sum = vectorN;
  uint32_t msb_sum = 0;
  int i = 0;
  for (; i < vectorN; i++) {
    uint32_t x = data[i];
    if (ZigZag) {
      x = WireFormatLite::ZigZagEncode32(x);
    } else if (SignExtended) {
      msb_sum += x >> 31;
    }
    // clang is so smart that it produces optimal SIMD sequence unrolling
    // the loop 8 ints at a time. With a sequence of 4
    // cmpres = cmpgt x, sizeclass  ( -1 or 0)
    // sum = sum - cmpres
    if (x > 0x7F) sum++;
    if (x > 0x3FFF) sum++;
    if (x > 0x1FFFFF) sum++;
    if (x > 0xFFFFFFF) sum++;
  }
#ifdef __clang__
// Clang is not smart enough to see that this loop doesn't run many times
// NOLINTNEXTLINE(google3-runtime-pragma-loop-hint): b/315043579
#pragma clang loop vectorize(disable) unroll(disable) interleave(disable)
#endif
  for (; i < n; i++) {
    uint32_t x = data[i];
    if (ZigZag) {
      sum += WireFormatLite::SInt32Size(x);
    } else if (SignExtended) {
      sum += WireFormatLite::Int32Size(x);
    } else {
      sum += WireFormatLite::UInt32Size(x);
    }
  }
  if (SignExtended) sum += msb_sum * 5;
  return sum;
}